

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

secp256k1_context * secp256k1_context_preallocated_clone(secp256k1_context *ctx,void *prealloc)

{
  secp256k1_context *psVar1;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_context_preallocated_clone_cold_3();
  }
  else if (prealloc != (void *)0x0) {
    if ((ctx->ecmult_gen_ctx).built == 0) {
      secp256k1_context_preallocated_clone_cold_1();
      return (secp256k1_context *)0x0;
    }
    psVar1 = (secp256k1_context *)memcpy(prealloc,ctx,200);
    return psVar1;
  }
  secp256k1_context_preallocated_clone_cold_2();
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_clone(const secp256k1_context* ctx, void* prealloc) {
    secp256k1_context* ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(prealloc != NULL);
    ARG_CHECK(secp256k1_context_is_proper(ctx));

    ret = (secp256k1_context*)prealloc;
    *ret = *ctx;
    return ret;
}